

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O2

void __thiscall
Assimp::ASE::Parser::ParseLV3MeshVertexListBlock(Parser *this,uint iNumVertices,Mesh *mesh)

{
  pointer paVar1;
  bool bVar2;
  byte *pbVar3;
  byte bVar4;
  int local_50;
  uint iIndex;
  undefined8 local_48;
  float local_40;
  Mesh *local_38;
  
  local_38 = mesh;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)mesh,
             (ulong)iNumVertices);
  local_50 = 0;
  do {
    while( true ) {
      pbVar3 = (byte *)this->filePtr;
      bVar4 = *pbVar3;
      if (bVar4 != 0x2a) break;
      this->filePtr = (char *)(pbVar3 + 1);
      bVar2 = TokenMatch<char_const>(&this->filePtr,"MESH_VERTEX",0xb);
      if (!bVar2) {
        pbVar3 = (byte *)this->filePtr;
        bVar4 = *pbVar3;
        break;
      }
      local_48 = 0;
      local_40 = 0.0;
      ParseLV4MeshFloatTriple(this,(ai_real *)&local_48,&iIndex);
      if (iIndex < iNumVertices) {
        paVar1 = (local_38->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *(float *)((long)(paVar1 + iIndex) + 8) = local_40;
        paVar1 = paVar1 + iIndex;
        paVar1->x = (float)(undefined4)local_48;
        paVar1->y = (float)local_48._4_4_;
      }
      else {
        LogWarning(this,"Invalid vertex index. It will be ignored");
      }
    }
    if ((bVar4 - 0xc < 2) || (bVar4 == 10)) {
      if (this->bLastWasEndLine != false) goto LAB_003d9d76;
      this->iLineNumber = this->iLineNumber + 1;
      bVar2 = true;
    }
    else {
      if (bVar4 == 0x7b) {
        local_50 = local_50 + 1;
      }
      else if (bVar4 == 0x7d) {
        local_50 = local_50 + -1;
        if (local_50 == 0) {
          this->filePtr = (char *)(pbVar3 + 1);
          SkipToNextToken(this);
          return;
        }
      }
      else if (bVar4 == 0) {
        LogError(this,"Encountered unexpected EOL while parsing a *MESH_VERTEX_LIST chunk (Level 3)"
                );
      }
LAB_003d9d76:
      bVar2 = false;
    }
    this->bLastWasEndLine = bVar2;
    this->filePtr = (char *)(pbVar3 + 1);
  } while( true );
}

Assistant:

void Parser::ParseLV3MeshVertexListBlock(
    unsigned int iNumVertices, ASE::Mesh& mesh)
{
    AI_ASE_PARSER_INIT();

    // allocate enough storage in the array
    mesh.mPositions.resize(iNumVertices);
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Vertex entry
            if (TokenMatch(filePtr,"MESH_VERTEX" ,11))
            {

                aiVector3D vTemp;
                unsigned int iIndex;
                ParseLV4MeshFloatTriple(&vTemp.x,iIndex);

                if (iIndex >= iNumVertices)
                {
                    LogWarning("Invalid vertex index. It will be ignored");
                }
                else mesh.mPositions[iIndex] = vTemp;
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_VERTEX_LIST");
    }
    return;
}